

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

DataModel * __thiscall Rml::Context::GetDataModelPtr(Context *this,String *name)

{
  DataModel *pDVar1;
  const_iterator cVar2;
  
  cVar2 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this->data_models,name);
  if (cVar2.mKeyVals == (NodePtr)(this->data_models).mInfo) {
    pDVar1 = (DataModel *)0x0;
  }
  else {
    pDVar1 = ((cVar2.mKeyVals)->mData).second._M_t.
             super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
             super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
             super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl;
  }
  return pDVar1;
}

Assistant:

DataModel* Context::GetDataModelPtr(const String& name) const
{
	auto it = data_models.find(name);
	if (it != data_models.end())
		return it->second.get();
	return nullptr;
}